

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

uint64_t __thiscall tcmalloc::PageHeap::ReleaseSpan(PageHeap *this,Span *span)

{
  bool bVar1;
  int iVar2;
  Span *span_00;
  uint64_t uVar3;
  
  if (span->location != 1) {
    __assert_fail("span->location == Span::IN_NORMAL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0x131,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
  }
  iVar2 = madvise((void *)(span->page_id << 0xd),span->npages << 0xd,8);
  if (iVar2 == -1) {
    uVar3 = 0;
  }
  else {
    uVar3 = span->npages;
    RemoveFromFreeList(this,span);
    span->location = 2;
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x13b,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
    span_00 = MergePrevAndNextSpans(this,span);
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x13d,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
    InsertToFreeList(this,span_00);
    bVar1 = CheckSmallList(this);
    if (!bVar1) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x13f,"uint64_t tcmalloc::PageHeap::ReleaseSpan(Span *)");
    }
  }
  return uVar3;
}

Assistant:

uint64_t ReleaseSpan(Span* span) {
        assert(span->location == Span::IN_NORMAL);
        if (!SystemRelease(
                reinterpret_cast<void *>(span->page_id * spanPageSize),
                span->npages * spanPageSize))
        {
            return 0;
        }
        uint64_t old_pages = span->npages;
        RemoveFromFreeList(span);
        span->location = Span::IN_RETURNED;
        assert(CheckSmallList());
        span = MergePrevAndNextSpans(span);
        assert(CheckSmallList());
        InsertToFreeList(span);
        assert(CheckSmallList());
        return old_pages;
    }